

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O3

void __thiscall leveldb::_Test_IterSmallAndLargeMix::_Run(_Test_IterSmallAndLargeMix *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  DB *pDVar3;
  int iVar4;
  undefined4 extraout_var;
  long *plVar5;
  size_type *psVar6;
  string local_248;
  Status local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_200;
  size_type sStack_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  undefined4 local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  Tester local_1d0;
  Iterator *iter;
  
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1d0.line_ = 0x38e;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1d0.ss_);
  paVar1 = &local_248.field_2;
  local_248._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"a","");
  paVar2 = &local_220.field_2;
  local_220._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"va","");
  local_200 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_248._M_dataplus._M_p;
  sStack_1f8 = local_248._M_string_length;
  local_1e0 = local_220._M_dataplus._M_p._0_4_;
  uStack_1dc = local_220._M_dataplus._M_p._4_4_;
  uStack_1d8 = (undefined4)local_220._M_string_length;
  uStack_1d4 = local_220._M_string_length._4_4_;
  (*((this->super_DBTest).db_)->_vptr_DB[2])(&local_228);
  test::Tester::IsOk(&local_1d0,&local_228);
  if (local_228.state_ != (char *)0x0) {
    operator_delete__(local_228.state_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != paVar2) {
    operator_delete(local_220._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != paVar1) {
    operator_delete(local_248._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1d0);
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1d0.line_ = 0x38f;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1d0.ss_);
  local_248._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"b","");
  local_220._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct((ulong)&local_220,-0x60);
  local_200 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_248._M_dataplus._M_p;
  sStack_1f8 = local_248._M_string_length;
  local_1e0 = local_220._M_dataplus._M_p._0_4_;
  uStack_1dc = local_220._M_dataplus._M_p._4_4_;
  uStack_1d8 = (undefined4)local_220._M_string_length;
  uStack_1d4 = local_220._M_string_length._4_4_;
  (*((this->super_DBTest).db_)->_vptr_DB[2])(&local_228);
  test::Tester::IsOk(&local_1d0,&local_228);
  if (local_228.state_ != (char *)0x0) {
    operator_delete__(local_228.state_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != paVar2) {
    operator_delete(local_220._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != paVar1) {
    operator_delete(local_248._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1d0);
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1d0.line_ = 0x390;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1d0.ss_);
  local_248._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"c","");
  local_220._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"vc","");
  local_200 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_248._M_dataplus._M_p;
  sStack_1f8 = local_248._M_string_length;
  local_1e0 = local_220._M_dataplus._M_p._0_4_;
  uStack_1dc = local_220._M_dataplus._M_p._4_4_;
  uStack_1d8 = (undefined4)local_220._M_string_length;
  uStack_1d4 = local_220._M_string_length._4_4_;
  (*((this->super_DBTest).db_)->_vptr_DB[2])(&local_228);
  test::Tester::IsOk(&local_1d0,&local_228);
  if (local_228.state_ != (char *)0x0) {
    operator_delete__(local_228.state_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != paVar2) {
    operator_delete(local_220._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != paVar1) {
    operator_delete(local_248._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1d0);
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1d0.line_ = 0x391;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1d0.ss_);
  local_248._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"d","");
  local_220._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct((ulong)&local_220,-0x60);
  local_200 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_248._M_dataplus._M_p;
  sStack_1f8 = local_248._M_string_length;
  local_1e0 = local_220._M_dataplus._M_p._0_4_;
  uStack_1dc = local_220._M_dataplus._M_p._4_4_;
  uStack_1d8 = (undefined4)local_220._M_string_length;
  uStack_1d4 = local_220._M_string_length._4_4_;
  (*((this->super_DBTest).db_)->_vptr_DB[2])(&local_228);
  test::Tester::IsOk(&local_1d0,&local_228);
  if (local_228.state_ != (char *)0x0) {
    operator_delete__(local_228.state_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != paVar2) {
    operator_delete(local_220._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != paVar1) {
    operator_delete(local_248._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1d0);
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1d0.line_ = 0x392;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1d0.ss_);
  local_248._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"e","");
  local_220._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct((ulong)&local_220,-0x60);
  local_200 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_248._M_dataplus._M_p;
  sStack_1f8 = local_248._M_string_length;
  local_1e0 = local_220._M_dataplus._M_p._0_4_;
  uStack_1dc = local_220._M_dataplus._M_p._4_4_;
  uStack_1d8 = (undefined4)local_220._M_string_length;
  uStack_1d4 = local_220._M_string_length._4_4_;
  (*((this->super_DBTest).db_)->_vptr_DB[2])(&local_228);
  test::Tester::IsOk(&local_1d0,&local_228);
  if (local_228.state_ != (char *)0x0) {
    operator_delete__(local_228.state_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != paVar2) {
    operator_delete(local_220._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != paVar1) {
    operator_delete(local_248._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1d0);
  pDVar3 = (this->super_DBTest).db_;
  local_1d0.fname_ = (char *)0x0;
  local_1d0.ok_ = false;
  local_1d0._1_7_ = 1;
  iVar4 = (*pDVar3->_vptr_DB[6])(pDVar3,&local_1d0);
  iter = (Iterator *)CONCAT44(extraout_var,iVar4);
  (*iter->_vptr_Iterator[3])(iter);
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1d0.line_ = 0x397;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1d0.ss_);
  DBTest::IterStatus_abi_cxx11_(&local_248,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[6]>(&local_1d0,&local_248,(char (*) [6])"a->va");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1d0);
  (*iter->_vptr_Iterator[6])(iter);
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1d0.line_ = 0x399;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1d0.ss_);
  DBTest::IterStatus_abi_cxx11_(&local_248,&this->super_DBTest,iter);
  local_200 = &local_1f0;
  std::__cxx11::string::_M_construct((ulong)&local_200,-0x60);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_200,0,(char *)0x0,0x1413a5);
  psVar6 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_220.field_2._M_allocated_capacity = *psVar6;
    local_220.field_2._8_8_ = plVar5[3];
    local_220._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_220.field_2._M_allocated_capacity = *psVar6;
    local_220._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_220._M_string_length = plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  test::Tester::IsEq<std::__cxx11::string,std::__cxx11::string>(&local_1d0,&local_248,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != paVar2) {
    operator_delete(local_220._M_dataplus._M_p);
  }
  if (local_200 != &local_1f0) {
    operator_delete(local_200);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1d0);
  (*iter->_vptr_Iterator[6])(iter);
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1d0.line_ = 0x39b;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1d0.ss_);
  DBTest::IterStatus_abi_cxx11_(&local_248,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[6]>(&local_1d0,&local_248,(char (*) [6])"c->vc");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1d0);
  (*iter->_vptr_Iterator[6])(iter);
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1d0.line_ = 0x39d;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1d0.ss_);
  DBTest::IterStatus_abi_cxx11_(&local_248,&this->super_DBTest,iter);
  local_200 = &local_1f0;
  std::__cxx11::string::_M_construct((ulong)&local_200,-0x60);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_200,0,(char *)0x0,0x1413a9);
  psVar6 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_220.field_2._M_allocated_capacity = *psVar6;
    local_220.field_2._8_8_ = plVar5[3];
    local_220._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_220.field_2._M_allocated_capacity = *psVar6;
    local_220._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_220._M_string_length = plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  test::Tester::IsEq<std::__cxx11::string,std::__cxx11::string>(&local_1d0,&local_248,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != paVar2) {
    operator_delete(local_220._M_dataplus._M_p);
  }
  if (local_200 != &local_1f0) {
    operator_delete(local_200);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1d0);
  (*iter->_vptr_Iterator[6])(iter);
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1d0.line_ = 0x39f;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1d0.ss_);
  DBTest::IterStatus_abi_cxx11_(&local_248,&this->super_DBTest,iter);
  local_200 = &local_1f0;
  std::__cxx11::string::_M_construct((ulong)&local_200,-0x60);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_200,0,(char *)0x0,0x1413ad);
  psVar6 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_220.field_2._M_allocated_capacity = *psVar6;
    local_220.field_2._8_8_ = plVar5[3];
    local_220._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_220.field_2._M_allocated_capacity = *psVar6;
    local_220._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_220._M_string_length = plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  test::Tester::IsEq<std::__cxx11::string,std::__cxx11::string>(&local_1d0,&local_248,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != paVar2) {
    operator_delete(local_220._M_dataplus._M_p);
  }
  if (local_200 != &local_1f0) {
    operator_delete(local_200);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1d0);
  (*iter->_vptr_Iterator[6])(iter);
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1d0.line_ = 0x3a1;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1d0.ss_);
  DBTest::IterStatus_abi_cxx11_(&local_248,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[10]>
            (&local_1d0,&local_248,(char (*) [10])"(invalid)");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1d0);
  (*iter->_vptr_Iterator[4])(iter);
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1d0.line_ = 0x3a4;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1d0.ss_);
  DBTest::IterStatus_abi_cxx11_(&local_248,&this->super_DBTest,iter);
  local_200 = &local_1f0;
  std::__cxx11::string::_M_construct((ulong)&local_200,-0x60);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_200,0,(char *)0x0,0x1413ad);
  psVar6 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_220.field_2._M_allocated_capacity = *psVar6;
    local_220.field_2._8_8_ = plVar5[3];
    local_220._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_220.field_2._M_allocated_capacity = *psVar6;
    local_220._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_220._M_string_length = plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  test::Tester::IsEq<std::__cxx11::string,std::__cxx11::string>(&local_1d0,&local_248,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != paVar2) {
    operator_delete(local_220._M_dataplus._M_p);
  }
  if (local_200 != &local_1f0) {
    operator_delete(local_200);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1d0);
  (*iter->_vptr_Iterator[7])(iter);
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1d0.line_ = 0x3a6;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1d0.ss_);
  DBTest::IterStatus_abi_cxx11_(&local_248,&this->super_DBTest,iter);
  local_200 = &local_1f0;
  std::__cxx11::string::_M_construct((ulong)&local_200,-0x60);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_200,0,(char *)0x0,0x1413a9);
  psVar6 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_220.field_2._M_allocated_capacity = *psVar6;
    local_220.field_2._8_8_ = plVar5[3];
    local_220._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_220.field_2._M_allocated_capacity = *psVar6;
    local_220._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_220._M_string_length = plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  test::Tester::IsEq<std::__cxx11::string,std::__cxx11::string>(&local_1d0,&local_248,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != paVar2) {
    operator_delete(local_220._M_dataplus._M_p);
  }
  if (local_200 != &local_1f0) {
    operator_delete(local_200);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1d0);
  (*iter->_vptr_Iterator[7])(iter);
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1d0.line_ = 0x3a8;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1d0.ss_);
  DBTest::IterStatus_abi_cxx11_(&local_248,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[6]>(&local_1d0,&local_248,(char (*) [6])"c->vc");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1d0);
  (*iter->_vptr_Iterator[7])(iter);
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1d0.line_ = 0x3aa;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1d0.ss_);
  DBTest::IterStatus_abi_cxx11_(&local_248,&this->super_DBTest,iter);
  local_200 = &local_1f0;
  std::__cxx11::string::_M_construct((ulong)&local_200,-0x60);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_200,0,(char *)0x0,0x1413a5);
  psVar6 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_220.field_2._M_allocated_capacity = *psVar6;
    local_220.field_2._8_8_ = plVar5[3];
    local_220._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_220.field_2._M_allocated_capacity = *psVar6;
    local_220._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_220._M_string_length = plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  test::Tester::IsEq<std::__cxx11::string,std::__cxx11::string>(&local_1d0,&local_248,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != paVar2) {
    operator_delete(local_220._M_dataplus._M_p);
  }
  if (local_200 != &local_1f0) {
    operator_delete(local_200);
  }
  paVar1 = &local_248.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != paVar1) {
    operator_delete(local_248._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1d0);
  (*iter->_vptr_Iterator[7])(iter);
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1d0.line_ = 0x3ac;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1d0.ss_);
  DBTest::IterStatus_abi_cxx11_(&local_248,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[6]>(&local_1d0,&local_248,(char (*) [6])"a->va");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != paVar1) {
    operator_delete(local_248._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1d0);
  (*iter->_vptr_Iterator[7])(iter);
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1d0.line_ = 0x3ae;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1d0.ss_);
  DBTest::IterStatus_abi_cxx11_(&local_248,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[10]>
            (&local_1d0,&local_248,(char (*) [10])"(invalid)");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != paVar1) {
    operator_delete(local_248._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1d0);
  (*iter->_vptr_Iterator[1])(iter);
  return;
}

Assistant:

TEST(DBTest, IterSmallAndLargeMix) {
  ASSERT_OK(Put("a", "va"));
  ASSERT_OK(Put("b", std::string(100000, 'b')));
  ASSERT_OK(Put("c", "vc"));
  ASSERT_OK(Put("d", std::string(100000, 'd')));
  ASSERT_OK(Put("e", std::string(100000, 'e')));

  Iterator* iter = db_->NewIterator(ReadOptions());

  iter->SeekToFirst();
  ASSERT_EQ(IterStatus(iter), "a->va");
  iter->Next();
  ASSERT_EQ(IterStatus(iter), "b->" + std::string(100000, 'b'));
  iter->Next();
  ASSERT_EQ(IterStatus(iter), "c->vc");
  iter->Next();
  ASSERT_EQ(IterStatus(iter), "d->" + std::string(100000, 'd'));
  iter->Next();
  ASSERT_EQ(IterStatus(iter), "e->" + std::string(100000, 'e'));
  iter->Next();
  ASSERT_EQ(IterStatus(iter), "(invalid)");

  iter->SeekToLast();
  ASSERT_EQ(IterStatus(iter), "e->" + std::string(100000, 'e'));
  iter->Prev();
  ASSERT_EQ(IterStatus(iter), "d->" + std::string(100000, 'd'));
  iter->Prev();
  ASSERT_EQ(IterStatus(iter), "c->vc");
  iter->Prev();
  ASSERT_EQ(IterStatus(iter), "b->" + std::string(100000, 'b'));
  iter->Prev();
  ASSERT_EQ(IterStatus(iter), "a->va");
  iter->Prev();
  ASSERT_EQ(IterStatus(iter), "(invalid)");

  delete iter;
}